

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

double google::protobuf::internal::NoLocaleStrtod(char *str,char **endptr)

{
  undefined1 auVar1 [8];
  int iVar2;
  LogMessage *pLVar3;
  size_t sVar4;
  char *local_90;
  char *temp_endptr;
  undefined1 local_80 [8];
  string localized;
  char acStack_49 [2];
  undefined1 auStack_47 [7];
  char *localized_endptr;
  LogFinisher local_31;
  
  temp_endptr = (char *)strtod(str,&local_90);
  if (endptr != (char **)0x0) {
    *endptr = local_90;
  }
  if (*local_90 == '.') {
    iVar2 = snprintf((char *)((long)acStack_49 + 1),0x10,"%.1f",0x3ff8000000000000);
    if (acStack_49[1] != '1') {
      LogMessage::LogMessage
                ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/strutil.cc"
                 ,0x982);
      pLVar3 = LogMessage::operator<<((LogMessage *)local_80,"CHECK failed: (temp[0]) == (\'1\'): ")
      ;
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage((LogMessage *)local_80);
    }
    if (acStack_49[iVar2] != '5') {
      LogMessage::LogMessage
                ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/strutil.cc"
                 ,0x983);
      pLVar3 = LogMessage::operator<<
                         ((LogMessage *)local_80,"CHECK failed: (temp[size - 1]) == (\'5\'): ");
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage((LogMessage *)local_80);
    }
    if (6 < iVar2) {
      LogMessage::LogMessage
                ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/strutil.cc"
                 ,0x984);
      pLVar3 = LogMessage::operator<<((LogMessage *)local_80,"CHECK failed: (size) <= (6): ");
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage((LogMessage *)local_80);
    }
    local_80 = (undefined1  [8])&localized._M_string_length;
    localized._M_dataplus._M_p = (pointer)0x0;
    localized._M_string_length._0_1_ = 0;
    strlen(str);
    std::__cxx11::string::reserve((ulong)local_80);
    std::__cxx11::string::append<char_const*,void>((string *)local_80,str,local_90);
    std::__cxx11::string::append(local_80,(ulong)auStack_47);
    std::__cxx11::string::append(local_80);
    auVar1 = local_80;
    temp_endptr = (char *)strtod((char *)local_80,(char **)((long)acStack_49 + 1));
    if ((endptr != (char **)0x0) &&
       ((long)local_90 - (long)str < CONCAT71(auStack_47,acStack_49[1]) - (long)auVar1)) {
      iVar2 = (int)localized._M_dataplus._M_p;
      sVar4 = strlen(str);
      *endptr = str + (CONCAT71(auStack_47,acStack_49[1]) -
                      ((long)(iVar2 - (int)sVar4) + (long)auVar1));
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  return (double)temp_endptr;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char *temp_endptr;
  double result = strtod(str, &temp_endptr);
  if (endptr != NULL) *endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  std::string localized = LocalizeRadix(str, temp_endptr);
  const char *localized_cstr = localized.c_str();
  char *localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) > (temp_endptr - str)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update endptr to point at the right location.
    if (endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(str);
      // const_cast is necessary to match the strtod() interface.
      *endptr = const_cast<char *>(
          str + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}